

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall
ImGuiListClipper::ForceDisplayRangeByIndices(ImGuiListClipper *this,int item_min,int item_max)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  void *__dest;
  int iVar6;
  int iVar7;
  
  if (item_min < item_max) {
    pvVar3 = this->TempData;
    iVar2 = *(int *)((long)pvVar3 + 0x1c);
    if (*(int *)((long)pvVar3 + 0x18) == iVar2) {
      iVar7 = *(int *)((long)pvVar3 + 0x18) + 1;
      if (iVar2 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar2 / 2 + iVar2;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar2 < iVar7) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (*GImAllocatorAllocFunc)((long)iVar7 * 0xc,GImAllocatorUserData);
        if (*(void **)((long)pvVar3 + 0x20) != (void *)0x0) {
          memcpy(__dest,*(void **)((long)pvVar3 + 0x20),(long)*(int *)((long)pvVar3 + 0x18) * 0xc);
          pvVar4 = *(void **)((long)pvVar3 + 0x20);
          if ((pvVar4 != (void *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar4,GImAllocatorUserData);
        }
        *(void **)((long)pvVar3 + 0x20) = __dest;
        *(int *)((long)pvVar3 + 0x1c) = iVar7;
      }
    }
    lVar5 = *(long *)((long)pvVar3 + 0x20);
    iVar2 = *(int *)((long)pvVar3 + 0x18);
    *(ulong *)(lVar5 + (long)iVar2 * 0xc) = CONCAT44(item_max,item_min);
    *(undefined4 *)(lVar5 + 8 + (long)iVar2 * 0xc) = 0;
    *(int *)((long)pvVar3 + 0x18) = *(int *)((long)pvVar3 + 0x18) + 1;
  }
  return;
}

Assistant:

void ImGuiListClipper::ForceDisplayRangeByIndices(int item_min, int item_max)
{
    ImGuiListClipperData* data = (ImGuiListClipperData*)TempData;
    IM_ASSERT(DisplayStart < 0); // Only allowed after Begin() and if there has not been a specified range yet.
    IM_ASSERT(item_min <= item_max);
    if (item_min < item_max)
        data->Ranges.push_back(ImGuiListClipperRange::FromIndices(item_min, item_max));
}